

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

void __thiscall qclab::print<double>(qclab *this,complex<double> val)

{
  byte bVar1;
  double in_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  
  dVar2 = cabs(in_XMM0_Qa);
  if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    printf("                   0");
    return;
  }
  bVar1 = (in_XMM1_Qa < 0.0) * '\x02' + 0x2b;
  if ((in_XMM0_Qa == 0.0) && (!NAN(in_XMM0_Qa))) {
    printf("         0 %c %6.4fi",ABS(in_XMM1_Qa),(ulong)bVar1);
    return;
  }
  if ((in_XMM1_Qa == 0.0) && (!NAN(in_XMM1_Qa))) {
    printf("%10.4f %c      0i",(ulong)bVar1);
    return;
  }
  printf("%10.4f %c %6.4fi",(ulong)bVar1);
  return;
}

Assistant:

void print( const std::complex< T > val ) {
    const T real = std::real( val ) ;
    const T imag = std::abs( std::imag( val ) ) ;
    const char sign = std::imag( val ) >= T(0) ? '+' : '-' ;
    if ( std::abs( val ) == T(0) ) {
      std::printf( "                   0" ) ;
    } else if ( std::abs( real ) == T(0) ) {
      std::printf( "         0 %c %6.4fi" , sign , imag ) ;
    } else if ( imag == T(0) ) {
      std::printf( "%10.4f %c      0i" , real , sign ) ;
    } else {
      std::printf( "%10.4f %c %6.4fi" , real , sign , imag ) ;
    }
  }